

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationLayer.cpp
# Opt level: O0

void __thiscall SerializationLayer::handlePacket(SerializationLayer *this,Buffer *packet)

{
  Buffer local_30;
  Buffer *local_18;
  Buffer *packet_local;
  SerializationLayer *this_local;
  
  local_18 = packet;
  packet_local = (Buffer *)this;
  Buffer::Buffer(&local_30,packet);
  SynchronizedQueue<Buffer>::put(&this->packetQueue,&local_30);
  Buffer::~Buffer(&local_30);
  return;
}

Assistant:

void SerializationLayer::handlePacket(Buffer packet) {
    packetQueue.put(packet);
}